

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.cpp
# Opt level: O0

void __thiscall FIX::FileLog::~FileLog(FileLog *this)

{
  FileLog *this_local;
  
  (this->super_Log)._vptr_Log = (_func_int **)&PTR__FileLog_0032f9d0;
  std::ofstream::close();
  std::ofstream::close();
  std::__cxx11::string::~string((string *)&this->m_fullBackupPrefix);
  std::__cxx11::string::~string((string *)&this->m_fullPrefix);
  std::__cxx11::string::~string((string *)&this->m_eventFileName);
  std::__cxx11::string::~string((string *)&this->m_messagesFileName);
  std::ofstream::~ofstream(&this->m_event);
  std::ofstream::~ofstream(&this->m_messages);
  Log::~Log(&this->super_Log);
  return;
}

Assistant:

FileLog::~FileLog() {
  m_messages.close();
  m_event.close();
}